

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep.cpp
# Opt level: O2

bool __thiscall ON_Brep::IsValidTrim(ON_Brep *this,int trim_index,ON_TextLog *text_log)

{
  ON_3dPoint *pOVar1;
  ON_BrepTrim *this_00;
  double dVar2;
  double dVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  ON_BrepTrim *pOVar7;
  ON_Curve *pOVar8;
  ON_BrepEdge *pOVar9;
  int *piVar10;
  bool bVar11;
  int iVar12;
  uint uVar13;
  ON_Curve *pOVar14;
  double *pdVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  char *pcVar20;
  double dVar21;
  ulong local_70;
  ulong local_60;
  ON_Interval c2_domain;
  ON_Interval trim_domain;
  
  uVar17 = (ulong)(uint)trim_index;
  if ((trim_index < 0) ||
     ((this->m_T).super_ON_ObjectArray<ON_BrepTrim>.super_ON_ClassArray<ON_BrepTrim>.m_count <=
      trim_index)) {
    if (text_log != (ON_TextLog *)0x0) {
      ON_TextLog::Print(text_log,"brep trim_index = %d (should be >=0 and <%d=brep.m_T.Count()).\n",
                        uVar17,(ulong)(uint)(this->m_T).super_ON_ObjectArray<ON_BrepTrim>.
                                            super_ON_ClassArray<ON_BrepTrim>.m_count);
    }
    goto LAB_00414cd6;
  }
  pOVar7 = (this->m_T).super_ON_ObjectArray<ON_BrepTrim>.super_ON_ClassArray<ON_BrepTrim>.m_a;
  this_00 = pOVar7 + uVar17;
  if (pOVar7[uVar17].m_trim_index != trim_index) {
    if (text_log == (ON_TextLog *)0x0) goto LAB_00414cd6;
    ON_TextLog::Print(text_log,"brep.m_T[%d] trim is not valid.\n",uVar17);
    ON_TextLog::PushIndent(text_log);
    uVar13 = this_00->m_trim_index;
    pcVar20 = "trim.m_trim_index = %d (should be %d).\n";
LAB_00414c70:
    ON_TextLog::Print(text_log,pcVar20,(ulong)uVar13,uVar17);
LAB_00414cce:
    ON_TextLog::PopIndent(text_log);
LAB_00414cd6:
    bVar11 = ON_IsNotValid();
    return bVar11;
  }
  iVar12 = (*(this_00->super_ON_CurveProxy).super_ON_Curve.super_ON_Geometry.super_ON_Object.
             _vptr_ON_Object[6])(this_00,text_log);
  if ((char)iVar12 == '\0') {
    if (text_log != (ON_TextLog *)0x0) {
      ON_TextLog::Print(text_log,"brep.m_T[%d] trim is not valid.\n",uVar17);
    }
    goto LAB_00414cd6;
  }
  iVar12 = this_00->m_c2i;
  if (((long)iVar12 < 0) || ((this->m_C2).super_ON_SimpleArray<ON_Curve_*>.m_count <= iVar12)) {
    if (text_log == (ON_TextLog *)0x0) goto LAB_00414cd6;
    ON_TextLog::Print(text_log,"brep.m_T[%d] trim is not valid.\n",uVar17);
    ON_TextLog::PushIndent(text_log);
    uVar4 = this_00->m_c2i;
    uVar13 = (this->m_C2).super_ON_SimpleArray<ON_Curve_*>.m_count;
    pcVar20 = "trim.m_c2i = %d (should be >=0 and <%d).\n";
    uVar17 = 0;
LAB_00414cc7:
    ON_TextLog::Print(text_log,pcVar20,(ulong)uVar4,uVar17,(ulong)uVar13);
    goto LAB_00414cce;
  }
  pOVar8 = (this->m_C2).super_ON_SimpleArray<ON_Curve_*>.m_a[iVar12];
  if (pOVar8 == (ON_Curve *)0x0) {
    if (text_log == (ON_TextLog *)0x0) goto LAB_00414cd6;
    ON_TextLog::Print(text_log,"brep.m_T[%d] trim is not valid.\n",uVar17);
    ON_TextLog::PushIndent(text_log);
    uVar13 = this_00->m_c2i;
    uVar17 = (ulong)uVar13;
    pcVar20 = "trim.m_c2i = %d and ON_Brep.m_C2[%d] is nullptr\n";
    goto LAB_00414c70;
  }
  uVar13 = (*(pOVar8->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x18])(pOVar8);
  if (uVar13 != 2) {
    if (text_log == (ON_TextLog *)0x0) goto LAB_00414cd6;
    ON_TextLog::Print(text_log,"brep.m_T[%d] trim is not valid.\n",uVar17);
    ON_TextLog::PushIndent(text_log);
    uVar4 = this_00->m_c2i;
    uVar17 = (ulong)uVar4;
    pcVar20 = "trim.m_c2i = %d and ON_Brep.m_C2[%d]->Dimension() = %d (should be 2).\n";
    goto LAB_00414cc7;
  }
  pOVar14 = ON_CurveProxy::ProxyCurve(&this_00->super_ON_CurveProxy);
  if (pOVar8 != pOVar14) {
    if (text_log == (ON_TextLog *)0x0) goto LAB_00414cd6;
    ON_TextLog::Print(text_log,"brep.m_T[%d] trim is not valid.\n",uVar17);
    ON_TextLog::PushIndent(text_log);
    ON_TextLog::Print(text_log,"trim.ProxyCurve() != m_C2[trim.m_c2i].\n");
    goto LAB_00414cce;
  }
  (*(this_00->super_ON_CurveProxy).super_ON_Curve.super_ON_Geometry.super_ON_Object._vptr_ON_Object
    [0x25])(this_00);
  (*(pOVar8->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x25])(pOVar8);
  bVar11 = ON_Interval::IsIncreasing(&trim_domain);
  if (!bVar11) {
    if (text_log == (ON_TextLog *)0x0) goto LAB_00414f9e;
    ON_TextLog::Print(text_log,"brep.m_T[%d] trim is not valid.\n",uVar17);
    ON_TextLog::PushIndent(text_log);
    pdVar15 = ON_Interval::operator[](&trim_domain,0);
    dVar21 = *pdVar15;
    pdVar15 = ON_Interval::operator[](&trim_domain,1);
    ON_TextLog::Print(text_log,"trim.Domain() = (%g,%g) (should be an increasing interval).\n",
                      dVar21,*pdVar15);
    goto LAB_00414f96;
  }
  bVar11 = ON_Interval::Includes(&c2_domain,&trim_domain,false);
  if (!bVar11) {
    if (text_log == (ON_TextLog *)0x0) goto LAB_00414f9e;
    ON_TextLog::Print(text_log,"brep.m_T[%d] trim is not valid.\n",uVar17);
    ON_TextLog::PushIndent(text_log);
    pdVar15 = ON_Interval::operator[](&trim_domain,0);
    dVar21 = *pdVar15;
    pdVar15 = ON_Interval::operator[](&trim_domain,1);
    dVar2 = *pdVar15;
    uVar13 = this_00->m_c2i;
    pdVar15 = ON_Interval::operator[](&c2_domain,0);
    dVar3 = *pdVar15;
    pdVar15 = ON_Interval::operator[](&c2_domain,1);
    ON_TextLog::Print(text_log,
                      "trim.Domain() = (%g,%g) is not included in brep.m_C2[trim.m_c2i=%d]->Domain() = (%g,%g)\n"
                      ,dVar21,dVar2,dVar3,*pdVar15,(ulong)uVar13);
    goto LAB_00414f96;
  }
  uVar13 = this_00->m_vi[0];
  if (((int)uVar13 < 0) ||
     (uVar4 = (this->m_V).super_ON_ObjectArray<ON_BrepVertex>.super_ON_ClassArray<ON_BrepVertex>.
              m_count, (int)uVar4 <= (int)uVar13)) {
    if (text_log == (ON_TextLog *)0x0) goto LAB_00414f9e;
    ON_TextLog::Print(text_log,"brep.m_T[%d] trim is not valid.\n",uVar17);
    ON_TextLog::PushIndent(text_log);
    pcVar20 = "trim.m_vi[0] = %d (should be >= 0 and < %d=brep.m_V.Count()).\n";
    local_70 = (ulong)uVar13;
    uVar18 = uVar17;
    uVar17 = (ulong)(uint)(this->m_V).super_ON_ObjectArray<ON_BrepVertex>.
                          super_ON_ClassArray<ON_BrepVertex>.m_count;
LAB_00414f8f:
    ON_TextLog::Print(text_log,pcVar20,uVar18,local_70,uVar17);
    goto LAB_00414f96;
  }
  uVar5 = this_00->m_vi[1];
  if ((int)uVar5 < 0 || uVar4 <= uVar5) {
    if (text_log == (ON_TextLog *)0x0) goto LAB_00414f9e;
    ON_TextLog::Print(text_log,"brep.m_T[%d] trim is not valid.\n",uVar17);
    ON_TextLog::PushIndent(text_log);
    uVar4 = (this->m_V).super_ON_ObjectArray<ON_BrepVertex>.super_ON_ClassArray<ON_BrepVertex>.
            m_count;
    pcVar20 = "trim.m_vi[1] = %d (should be >= 0 and < %d=brep.m_V.Count()).\n";
LAB_00414fe2:
    local_70 = (ulong)uVar5;
    uVar18 = uVar17;
    uVar17 = (ulong)uVar4;
    goto LAB_00414f8f;
  }
  local_60 = 0xffffffffffffffff;
  if (this_00->m_type != ptonsrf) {
    uVar4 = this_00->m_ei;
    uVar18 = (ulong)uVar4;
    if (this_00->m_type == singular) {
      if (uVar4 != 0xffffffff) {
        if (text_log == (ON_TextLog *)0x0) goto LAB_00414f9e;
        ON_TextLog::Print(text_log,"brep.m_T[%d] trim is not valid.\n",uVar17);
        ON_TextLog::PushIndent(text_log);
        pcVar20 = "trim.m_type = singular but trim.m_ei = %d (should be -1)\n";
        goto LAB_00415329;
      }
      if (uVar13 == uVar5) {
        iVar12 = (*(pOVar8->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x34])(pOVar8);
        if ((char)iVar12 == '\0') goto LAB_004152cb;
        if (text_log == (ON_TextLog *)0x0) goto LAB_00414f9e;
        ON_TextLog::Print(text_log,"brep.m_T[%d] trim is not valid.\n",uVar17);
        ON_TextLog::PushIndent(text_log);
        uVar18 = (ulong)(uint)this_00->m_c2i;
        pcVar20 = "trim.m_type = singular but brep.m_C2[trim.m_c2i=%d]->IsClosed() is true.\n";
        local_70 = (ulong)(uint)this_00->m_c2i;
      }
      else {
        if (text_log == (ON_TextLog *)0x0) goto LAB_00414f9e;
        ON_TextLog::Print(text_log,"brep.m_T[%d] trim is not valid.\n",uVar17);
        ON_TextLog::PushIndent(text_log);
        pcVar20 = 
        "trim.m_type = singular but trim.m_vi[] = [%d,%d] (the m_vi[] values should be equal).\n";
        uVar18 = (ulong)uVar5;
        local_70 = (ulong)uVar13;
      }
    }
    else {
      if ((-1 < (int)uVar4) &&
         ((int)uVar4 <
          (this->m_E).super_ON_ObjectArray<ON_BrepEdge>.super_ON_ClassArray<ON_BrepEdge>.m_count)) {
        pOVar9 = (this->m_E).super_ON_ObjectArray<ON_BrepEdge>.super_ON_ClassArray<ON_BrepEdge>.m_a;
        if (pOVar9[uVar18].m_vi[this_00->m_bRev3d] == uVar13) {
          if (pOVar9[uVar18].m_vi[this_00->m_bRev3d ^ 1] == uVar5) {
            bVar11 = ON_Interval::operator==(&trim_domain,&c2_domain);
            if (((bVar11) &&
                (iVar12 = (*(pOVar8->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x34])
                                    (pOVar8), (char)iVar12 != '\0')) && (uVar13 != uVar5)) {
              if (text_log == (ON_TextLog *)0x0) goto LAB_00414f9e;
              ON_TextLog::Print(text_log,"brep.m_T[%d] trim is not valid.\n",uVar17);
              ON_TextLog::PushIndent(text_log);
              uVar4 = this_00->m_c2i;
              pcVar20 = "trim.m_vi[] = [%d,%d] but brep.m_C2[trim.m_c2i=%d]->IsClosed()=true\n";
              uVar17 = (ulong)uVar13;
              goto LAB_00414fe2;
            }
            uVar13 = pOVar9[uVar18].m_ti.m_count;
            local_60 = 0;
            uVar19 = 0;
            if (0 < (int)uVar13) {
              uVar19 = (ulong)uVar13;
            }
            for (; uVar19 != local_60; local_60 = local_60 + 1) {
              piVar10 = pOVar9[uVar18].m_ti.m_a;
              if (piVar10[local_60] == trim_index) {
                if (uVar13 != 2) goto LAB_004152cb;
                iVar12 = piVar10[*piVar10 == trim_index];
                if ((((long)iVar12 < 0) || (iVar12 == trim_index)) ||
                   (((this->m_T).super_ON_ObjectArray<ON_BrepTrim>.super_ON_ClassArray<ON_BrepTrim>.
                     m_count <= iVar12 ||
                    (((this->m_T).super_ON_ObjectArray<ON_BrepTrim>.super_ON_ClassArray<ON_BrepTrim>
                      .m_a[iVar12].m_li != this_00->m_li || (this_00->m_type == seam))))))
                goto LAB_004152cb;
                if (text_log == (ON_TextLog *)0x0) goto LAB_00414f9e;
                ON_TextLog::Print(text_log,"brep.m_T[%d] trim is not valid.\n",uVar17);
                ON_TextLog::PushIndent(text_log);
                local_70 = (ulong)(uint)this_00->m_ei;
                uVar18 = (ulong)(uint)this_00->m_li;
                pcVar20 = 
                "trim.m_type!=seam but brep.m_E[trim.m_ei=%d] references two trims in loop trim.m_li=%d.\n"
                ;
                goto LAB_0041536e;
              }
            }
            if (text_log == (ON_TextLog *)0x0) goto LAB_00414f9e;
            ON_TextLog::Print(text_log,"brep.m_T[%d] trim is not valid.\n",uVar17);
            ON_TextLog::PushIndent(text_log);
            uVar18 = (ulong)(uint)this_00->m_ei;
            pcVar20 = "trim index %d is not in brep.m_E[trim.m_ei=%d].m_ti[]\n";
            local_70 = uVar17;
            goto LAB_0041536e;
          }
          if (text_log == (ON_TextLog *)0x0) goto LAB_00414f9e;
          ON_TextLog::Print(text_log,"brep.m_T[%d] trim is not valid.\n",uVar17);
          ON_TextLog::PushIndent(text_log);
          pcVar20 = "trim.m_vi[1] != brep.m_E[trim.m_ei=%d].m_vi[trim.m_bRev3d?0:1]\n";
        }
        else {
          if (text_log == (ON_TextLog *)0x0) goto LAB_00414f9e;
          ON_TextLog::Print(text_log,"brep.m_T[%d] trim is not valid.\n",uVar17);
          ON_TextLog::PushIndent(text_log);
          pcVar20 = "trim.m_vi[0] != brep.m_E[trim.m_ei=%d].m_vi[trim.m_bRev3d?1:0]\n";
        }
        goto LAB_00415329;
      }
      if (text_log == (ON_TextLog *)0x0) goto LAB_00414f9e;
      ON_TextLog::Print(text_log,"brep.m_T[%d] trim is not valid.\n",uVar17);
      ON_TextLog::PushIndent(text_log);
      local_70 = (ulong)(uint)this_00->m_ei;
      uVar18 = (ulong)(uint)(this->m_E).super_ON_ObjectArray<ON_BrepEdge>.
                            super_ON_ClassArray<ON_BrepEdge>.m_count;
      pcVar20 = 
      "trim.m_type != singular and trim.m_ei = %d (m_ei should be >=0 and <brep.m_E.Count()=%d\n";
    }
LAB_0041536e:
    ON_TextLog::Print(text_log,pcVar20,local_70,uVar18);
    goto LAB_00414f96;
  }
LAB_004152cb:
  iVar12 = this_00->m_li;
  lVar16 = (long)iVar12;
  if ((lVar16 < 0) ||
     ((this->m_L).super_ON_ObjectArray<ON_BrepLoop>.super_ON_ClassArray<ON_BrepLoop>.m_count <=
      iVar12)) {
    if (text_log == (ON_TextLog *)0x0) goto LAB_00414f9e;
    ON_TextLog::Print(text_log,"brep.m_T[%d] trim is not valid.\n",uVar17);
    ON_TextLog::PushIndent(text_log);
    local_70 = (ulong)(uint)this_00->m_li;
    uVar18 = (ulong)(uint)(this->m_L).super_ON_ObjectArray<ON_BrepLoop>.
                          super_ON_ClassArray<ON_BrepLoop>.m_count;
    pcVar20 = "trim.m_li = %d (should be >= 0 and <brep.m_L.Count()=%d\n";
    goto LAB_0041536e;
  }
  uVar18 = local_60 & 0xffffffff;
  iVar6 = this_00->m_ei;
  if (((int)local_60 < 0) && (-1 < iVar6)) {
    if (text_log == (ON_TextLog *)0x0) goto LAB_00414f9e;
    ON_TextLog::Print(text_log,"brep.m_T[%d] trim is not valid.\n",uVar17);
    ON_TextLog::PushIndent(text_log);
    uVar18 = (ulong)(uint)this_00->m_ei;
    pcVar20 = "brep.m_E[trim.m_ei=%d].m_ti[] does not reference the trim.\n";
    goto LAB_00415329;
  }
  if (trim_type_count < this_00->m_type) {
    if (text_log == (ON_TextLog *)0x0) goto LAB_00414f9e;
    ON_TextLog::Print(text_log,"brep.m_T[%d] trim is not valid.\n",uVar17);
    ON_TextLog::PushIndent(text_log);
    pcVar20 = "trim.m_type = garbage (should be set to the correct ON_BrepTrim::TYPE value)\n";
    goto LAB_00415680;
  }
  switch(this_00->m_type) {
  case unknown:
    if (text_log == (ON_TextLog *)0x0) goto LAB_00414f9e;
    ON_TextLog::Print(text_log,"brep.m_T[%d] trim is not valid.\n",uVar17);
    ON_TextLog::PushIndent(text_log);
    pcVar20 = "trim.m_type = unknown (should be set to the correct ON_BrepTrim::TYPE value)\n";
    break;
  case boundary:
    if ((this->m_E).super_ON_ObjectArray<ON_BrepEdge>.super_ON_ClassArray<ON_BrepEdge>.m_a[iVar6].
        m_ti.m_count < 2) {
      if ((this->m_L).super_ON_ObjectArray<ON_BrepLoop>.super_ON_ClassArray<ON_BrepLoop>.m_a[lVar16]
          .m_type - outer < 2) goto LAB_00415783;
      if (text_log == (ON_TextLog *)0x0) goto LAB_00414f9e;
      ON_TextLog::Print(text_log,"brep.m_T[%d] trim is not valid.\n",uVar17);
      ON_TextLog::PushIndent(text_log);
      uVar18 = (ulong)(uint)this_00->m_li;
      pcVar20 = "trim.m_type = boundary but brep.m_L[trim.m_li=%d].m_type is not inner or outer.\n";
    }
    else {
      if (text_log == (ON_TextLog *)0x0) goto LAB_00414f9e;
      ON_TextLog::Print(text_log,"brep.m_T[%d] trim is not valid.\n",uVar17);
      ON_TextLog::PushIndent(text_log);
      uVar18 = (ulong)(uint)this_00->m_ei;
      pcVar20 = "trim.m_type = boundary but brep.m_E[trim.m_ei=%d] has 2 or more trims.\n";
    }
    goto LAB_00415329;
  case mated:
    if ((this->m_E).super_ON_ObjectArray<ON_BrepEdge>.super_ON_ClassArray<ON_BrepEdge>.m_a[iVar6].
        m_ti.m_count < 2) {
      if (text_log == (ON_TextLog *)0x0) goto LAB_00414f9e;
      ON_TextLog::Print(text_log,"brep.m_T[%d] trim is not valid.\n",uVar17);
      ON_TextLog::PushIndent(text_log);
      uVar18 = (ulong)(uint)this_00->m_ei;
      pcVar20 = "trim.m_type = mated but brep.m_E[trim.m_ei=%d] only references this trim.\n";
    }
    else {
      if ((this->m_L).super_ON_ObjectArray<ON_BrepLoop>.super_ON_ClassArray<ON_BrepLoop>.m_a[lVar16]
          .m_type - outer < 2) goto LAB_00415783;
      if (text_log == (ON_TextLog *)0x0) goto LAB_00414f9e;
      ON_TextLog::Print(text_log,"brep.m_T[%d] trim is not valid.\n",uVar17);
      ON_TextLog::PushIndent(text_log);
      uVar18 = (ulong)(uint)this_00->m_li;
      pcVar20 = "trim.m_type = mated but brep.m_L[trim.m_li=%d].m_type is not inner or outer.\n";
    }
    goto LAB_00415329;
  case seam:
    pOVar9 = (this->m_E).super_ON_ObjectArray<ON_BrepEdge>.super_ON_ClassArray<ON_BrepEdge>.m_a;
    uVar13 = pOVar9[iVar6].m_ti.m_count;
    if ((int)uVar13 < 2) {
      if (text_log == (ON_TextLog *)0x0) goto LAB_00414f9e;
      ON_TextLog::Print(text_log,"brep.m_T[%d] trim is not valid.\n",uVar17);
      ON_TextLog::PushIndent(text_log);
      uVar18 = (ulong)(uint)this_00->m_ei;
      pcVar20 = "trim.m_type = seam but brep.m_E[trim.m_ei=%d] < 2.\n";
    }
    else {
      pOVar7 = (this->m_T).super_ON_ObjectArray<ON_BrepTrim>.super_ON_ClassArray<ON_BrepTrim>.m_a;
      uVar19 = 0xffffffffffffffff;
      for (local_70 = 0; uVar13 != local_70; local_70 = local_70 + 1) {
        if (uVar18 != local_70) {
          uVar4 = pOVar9[iVar6].m_ti.m_a[local_70];
          if (uVar4 == trim_index) {
            if (text_log == (ON_TextLog *)0x0) goto LAB_00414f9e;
            ON_TextLog::Print(text_log,"brep.m_E[%d] trim is not valid.\n");
            ON_TextLog::PushIndent(text_log);
            pcVar20 = "edge.m_ti[%d] = m_ti[%d] = %d.\n";
            goto LAB_00414f8f;
          }
          if (((int)uVar4 < 0) ||
             ((this->m_T).super_ON_ObjectArray<ON_BrepTrim>.super_ON_ClassArray<ON_BrepTrim>.m_count
              <= (int)uVar4)) {
            if (text_log == (ON_TextLog *)0x0) goto LAB_00414f9e;
            ON_TextLog::Print(text_log,"brep.m_E[%d] trim is not valid.\n");
            ON_TextLog::PushIndent(text_log);
            pcVar20 = "edge.m_ti[%d]=%d is not a valid m_T[] index.\n";
            uVar18 = (ulong)uVar4;
            goto LAB_0041536e;
          }
          if ((pOVar7[uVar4].m_type == seam) && (pOVar7[uVar4].m_li == iVar12)) {
            if (-1 < (int)uVar19) {
              if (text_log == (ON_TextLog *)0x0) goto LAB_00414f9e;
              ON_TextLog::Print(text_log,"brep.m_T[%d,%d, or %d] trim is not valid.\n",uVar17,uVar19
                                ,(ulong)uVar4);
              ON_TextLog::PushIndent(text_log);
              local_70 = (ulong)(uint)this_00->m_ei;
              uVar18 = (ulong)(uint)this_00->m_li;
              pcVar20 = "All three trims have m_type = seam m_ei=%d and m_li = %d.\n";
              goto LAB_0041536e;
            }
            uVar19 = (ulong)uVar4;
          }
        }
      }
      if ((int)uVar19 < 0) {
        if (text_log == (ON_TextLog *)0x0) goto LAB_00414f9e;
        ON_TextLog::Print(text_log,"brep.m_T[%d] trim is not valid.\n",uVar17);
        ON_TextLog::PushIndent(text_log);
        pcVar20 = "trim.m_type = seam but its other trim is not in the loop.\n";
        break;
      }
      if (((this->m_L).super_ON_ObjectArray<ON_BrepLoop>.super_ON_ClassArray<ON_BrepLoop>.m_a
           [lVar16].m_type == outer) || (uVar13 != 2)) goto LAB_00415783;
      if (text_log == (ON_TextLog *)0x0) goto LAB_00414f9e;
      ON_TextLog::Print(text_log,"brep.m_T[%d] trim is not valid.\n",uVar17);
      ON_TextLog::PushIndent(text_log);
      uVar18 = (ulong)(uint)this_00->m_li;
      pcVar20 = 
      "trim.m_type = seam, the edge is manifold, but brep.m_L[trim.m_li=%d].m_type is not outer.\n";
    }
LAB_00415329:
    ON_TextLog::Print(text_log,pcVar20,uVar18);
    goto LAB_00414f96;
  case singular:
    if (this_00->m_iso - W_iso < 4) goto LAB_00415783;
    if (text_log == (ON_TextLog *)0x0) goto LAB_00414f9e;
    ON_TextLog::Print(text_log,"brep.m_T[%d] trim is not valid.\n",uVar17);
    ON_TextLog::PushIndent(text_log);
    pcVar20 = "trim.m_type = singular but trim.m_iso != N/S/E/W_iso\n";
    break;
  case crvonsrf:
    if ((((this->m_L).super_ON_ObjectArray<ON_BrepLoop>.super_ON_ClassArray<ON_BrepLoop>.m_a[lVar16]
          .m_type != crvonsrf) || (this_00->m_c2i < 0)) ||
       (((this->m_C2).super_ON_SimpleArray<ON_Curve_*>.m_count <= this_00->m_c2i ||
        ((iVar6 < 0 ||
         ((this->m_E).super_ON_ObjectArray<ON_BrepEdge>.super_ON_ClassArray<ON_BrepEdge>.m_count <=
          iVar6)))))) goto LAB_00414f9e;
    goto LAB_00415783;
  case ptonsrf:
    if ((((this->m_L).super_ON_ObjectArray<ON_BrepLoop>.super_ON_ClassArray<ON_BrepLoop>.m_a[lVar16]
          .m_type != ptonsrf) || (iVar6 != -1)) || (this_00->m_c2i != -1)) goto LAB_00414f9e;
    dVar21 = (this_00->m_pbox).m_min.x;
    pOVar1 = &(this_00->m_pbox).m_max;
    if ((dVar21 != pOVar1->x) || (NAN(dVar21) || NAN(pOVar1->x))) goto LAB_00414f9e;
    dVar2 = (this_00->m_pbox).m_min.y;
    pdVar15 = &(this_00->m_pbox).m_max.y;
    if ((dVar2 != *pdVar15) || (NAN(dVar2) || NAN(*pdVar15))) goto LAB_00414f9e;
    dVar3 = (this_00->m_pbox).m_min.z;
    pdVar15 = &(this_00->m_pbox).m_max.z;
    if ((((dVar3 != *pdVar15) || (NAN(dVar3) || NAN(*pdVar15))) ||
        ((dVar21 == -1.23432101234321e+308 && (!NAN(dVar21))))) ||
       ((((dVar2 == -1.23432101234321e+308 && (!NAN(dVar2))) || (dVar3 != 0.0)) || (NAN(dVar3)))))
    goto LAB_00414f9e;
LAB_00415783:
    if (0.0 < this_00->m_tolerance[0] || this_00->m_tolerance[0] == 0.0) {
      if (0.0 < this_00->m_tolerance[1] || this_00->m_tolerance[1] == 0.0) {
        bVar11 = ON_BoundingBox::IsValid(&this_00->m_pbox);
        if (bVar11) {
          if (this_00->m_brep == this) {
            return true;
          }
          if (text_log == (ON_TextLog *)0x0) goto LAB_00414f9e;
          ON_TextLog::Print(text_log,"brep.m_T[%d] trim is not valid.\n",uVar17);
          ON_TextLog::PushIndent(text_log);
          pcVar20 = "trim.m_brep does not point to parent brep.\n";
        }
        else {
          if (text_log == (ON_TextLog *)0x0) goto LAB_00414f9e;
          ON_TextLog::Print(text_log,"brep.m_T[%d] trim is not valid.\n",uVar17);
          ON_TextLog::PushIndent(text_log);
          pcVar20 = "trim.m_pbox is not valid.\n";
        }
        break;
      }
      if (text_log == (ON_TextLog *)0x0) goto LAB_00414f9e;
      ON_TextLog::Print(text_log,"brep.m_T[%d] trim is not valid.\n",uVar17);
      ON_TextLog::PushIndent(text_log);
      dVar21 = this_00->m_tolerance[1];
      pcVar20 = "trim.m_tolerance[1] = %g (should be >= 0.0)\n";
    }
    else {
      if (text_log == (ON_TextLog *)0x0) goto LAB_00414f9e;
      ON_TextLog::Print(text_log,"brep.m_T[%d] trim is not valid.\n",uVar17);
      ON_TextLog::PushIndent(text_log);
      dVar21 = this_00->m_tolerance[0];
      pcVar20 = "trim.m_tolerance[0] = %g (should be >= 0.0)\n";
    }
    ON_TextLog::Print(text_log,pcVar20,dVar21);
    goto LAB_00414f96;
  case slit:
    if (text_log == (ON_TextLog *)0x0) goto LAB_00414f9e;
    ON_TextLog::Print(text_log,"brep.m_T[%d] trim is not valid.\n",uVar17);
    ON_TextLog::PushIndent(text_log);
    pcVar20 = 
    "trim.m_type = ON_BrepTrim::slit (should be set to the correct ON_BrepTrim::TYPE value)\n";
    break;
  case trim_type_count:
    if (text_log == (ON_TextLog *)0x0) goto LAB_00414f9e;
    ON_TextLog::Print(text_log,"brep.m_T[%d] trim is not valid.\n",uVar17);
    ON_TextLog::PushIndent(text_log);
    pcVar20 = "trim.m_type = type_count (should be set to the correct ON_BrepTrim::TYPE value)\n";
  }
LAB_00415680:
  ON_TextLog::Print(text_log,pcVar20);
LAB_00414f96:
  ON_TextLog::PopIndent(text_log);
LAB_00414f9e:
  bVar11 = ON_IsNotValid();
  return bVar11;
}

Assistant:

bool
ON_Brep::IsValidTrim( int trim_index, ON_TextLog* text_log ) const
{
  if ( trim_index < 0 || trim_index >= m_T.Count() )
  {
    if ( text_log )
    {
      text_log->Print("brep trim_index = %d (should be >=0 and <%d=brep.m_T.Count()).\n",
                      trim_index, m_T.Count());
    }
    return ON_BrepIsNotValid();
  }
  const ON_BrepTrim& trim = m_T[trim_index];
  if ( trim.m_trim_index != trim_index )
  {
    if ( text_log )
    {
      text_log->Print("brep.m_T[%d] trim is not valid.\n",trim_index);
      text_log->PushIndent();
      text_log->Print("trim.m_trim_index = %d (should be %d).\n",
                       trim.m_trim_index, trim_index );
      text_log->PopIndent();
    }
    return ON_BrepIsNotValid();
  }
  if ( !trim.IsValid(text_log) )
  {
    if ( text_log )
      text_log->Print("brep.m_T[%d] trim is not valid.\n",trim_index);
    return ON_BrepIsNotValid();
  }
  if ( trim.m_c2i < 0 || trim.m_c2i >= m_C2.Count() )
  {
    if ( text_log )
    {
      text_log->Print("brep.m_T[%d] trim is not valid.\n",trim_index);
      text_log->PushIndent();
      text_log->Print( "trim.m_c2i = %d (should be >=0 and <%d).\n", trim.m_c2i, 0, m_C2.Count() );
      text_log->PopIndent();
    }
    return ON_BrepIsNotValid();
  }
  const ON_Curve* pC = m_C2[trim.m_c2i];
  if ( !pC )
  {
    if ( text_log )
    {
      text_log->Print("brep.m_T[%d] trim is not valid.\n",trim_index);
      text_log->PushIndent();
      text_log->Print("trim.m_c2i = %d and ON_Brep.m_C2[%d] is nullptr\n", trim.m_c2i, trim.m_c2i );
      text_log->PopIndent();
    }
    return ON_BrepIsNotValid();
  }
  int c2_dim = pC->Dimension();
  if ( c2_dim != 2 )
  {
    if ( text_log )
    {
      text_log->Print("brep.m_T[%d] trim is not valid.\n",trim_index);
      text_log->PushIndent();
      text_log->Print("trim.m_c2i = %d and ON_Brep.m_C2[%d]->Dimension() = %d (should be 2).\n", trim.m_c2i, trim.m_c2i, c2_dim );
      text_log->PopIndent();
    }
    return ON_BrepIsNotValid();
  }

  if ( pC != trim.ProxyCurve() )
  {
    if ( text_log )
    {
      text_log->Print("brep.m_T[%d] trim is not valid.\n",trim_index);
      text_log->PushIndent();
      text_log->Print("trim.ProxyCurve() != m_C2[trim.m_c2i].\n");
      text_log->PopIndent();
    }
    return ON_BrepIsNotValid();
  }

  //if ( trim.ProxyCurveIsReversed() )
  //{
  //  if ( text_log )
  //  {
  //    text_log->Print("brep.m_T[%d] trim is not valid.\n",trim_index);
  //    text_log->PushIndent();
  //    text_log->Print("trim.ProxyCurveIsReversed() is true\n");
  //    text_log->PopIndent();
  //  }
  //  return ON_BrepIsNotValid();
  //}

  ON_Interval trim_domain = trim.Domain();
  ON_Interval c2_domain = pC->Domain();
  if ( !trim_domain.IsIncreasing() )
  {
    if ( text_log )
    {
      text_log->Print("brep.m_T[%d] trim is not valid.\n",trim_index);
      text_log->PushIndent();
      text_log->Print("trim.Domain() = (%g,%g) (should be an increasing interval).\n", trim_domain[0], trim_domain[1] );
      text_log->PopIndent();
    }
    return ON_BrepIsNotValid();
  }
  if ( !c2_domain.Includes(trim_domain) )
  {
    if ( text_log )
    {
      text_log->Print("brep.m_T[%d] trim is not valid.\n",trim_index);
      text_log->PushIndent();
      text_log->Print("trim.Domain() = (%g,%g) is not included in brep.m_C2[trim.m_c2i=%d]->Domain() = (%g,%g)\n",
                      trim_domain[0], trim_domain[1], trim.m_c2i, c2_domain[0], c2_domain[1] );
      text_log->PopIndent();
    }
    return ON_BrepIsNotValid();
  }
  int vi0 = trim.m_vi[0];
  int vi1 = trim.m_vi[1];
  if ( vi0 < 0 || vi0 >= m_V.Count() )
  {
    if ( text_log )
    {
      text_log->Print("brep.m_T[%d] trim is not valid.\n",trim_index);
      text_log->PushIndent();
      text_log->Print("trim.m_vi[0] = %d (should be >= 0 and < %d=brep.m_V.Count()).\n",
                       trim_index, vi0, m_V.Count() );
      text_log->PopIndent();
    }
    return ON_BrepIsNotValid();
  }
  if ( vi1 < 0 || vi1 >= m_V.Count() )
  {
    if ( text_log )
    {
      text_log->Print("brep.m_T[%d] trim is not valid.\n",trim_index);
      text_log->PushIndent();
      text_log->Print("trim.m_vi[1] = %d (should be >= 0 and < %d=brep.m_V.Count()).\n",
                       trim_index, vi1, m_V.Count() );
      text_log->PopIndent();
    }
    return ON_BrepIsNotValid();
  }
  const int ei = trim.m_ei;
  int trim_eti = -1;
  if ( trim.m_type == ON_BrepTrim::singular ) 
  {
    // singular trim - no edge and 3d v0 = 3d v1
    if ( ei != -1 )
    {
      if ( text_log )
      {
        text_log->Print("brep.m_T[%d] trim is not valid.\n",trim_index);
        text_log->PushIndent();
        text_log->Print("trim.m_type = singular but trim.m_ei = %d (should be -1)\n",ei);
        text_log->PopIndent();
      }
      return ON_BrepIsNotValid();
    }
    if ( vi0 != vi1 )
    {
      if ( text_log )
      {
        text_log->Print("brep.m_T[%d] trim is not valid.\n",trim_index);
        text_log->PushIndent();
        text_log->Print("trim.m_type = singular but trim.m_vi[] = [%d,%d] (the m_vi[] values should be equal).\n",
                        vi0,vi1);
        text_log->PopIndent();
      }
      return ON_BrepIsNotValid();
    }
    if ( pC->IsClosed() )
    {
      if ( text_log )
      {
        text_log->Print("brep.m_T[%d] trim is not valid.\n",trim_index);
        text_log->PushIndent();
        text_log->Print("trim.m_type = singular but brep.m_C2[trim.m_c2i=%d]->IsClosed() is true.\n",
                        trim.m_c2i,trim.m_c2i);
        text_log->PopIndent();
      }
      return ON_BrepIsNotValid();
    }
  }
  else if ( trim.m_type != ON_BrepTrim::ptonsrf )
  {
    // non-singular non-ptonsrf trim must have valid edge
    if ( ei < 0 || ei >= m_E.Count() )
    {
      if ( text_log )
      {
        text_log->Print("brep.m_T[%d] trim is not valid.\n",trim_index);
        text_log->PushIndent();
        text_log->Print("trim.m_type != singular and trim.m_ei = %d (m_ei should be >=0 and <brep.m_E.Count()=%d\n",
                        trim.m_ei,m_E.Count());
        text_log->PopIndent();
      }
      return ON_BrepIsNotValid();
    }
    const ON_BrepEdge& edge = m_E[ei];
    if ( edge.m_vi[trim.m_bRev3d?1:0] != vi0 )
    {
      if ( text_log )
      {
        text_log->Print("brep.m_T[%d] trim is not valid.\n",trim_index);
        text_log->PushIndent();
        text_log->Print("trim.m_vi[0] != brep.m_E[trim.m_ei=%d].m_vi[trim.m_bRev3d?1:0]\n",ei);
        text_log->PopIndent();
      }
      return ON_BrepIsNotValid();
    }
    if ( edge.m_vi[trim.m_bRev3d?0:1] != vi1 )
    {
      if ( text_log )
      {
        text_log->Print("brep.m_T[%d] trim is not valid.\n",trim_index);
        text_log->PushIndent();
        text_log->Print("trim.m_vi[1] != brep.m_E[trim.m_ei=%d].m_vi[trim.m_bRev3d?0:1]\n",ei);
        text_log->PopIndent();
      }
      return ON_BrepIsNotValid();
    }
    if ( trim_domain == c2_domain && pC->IsClosed() ) 
    {
      // (open 2d trims can still have vi0 = vi1 on closed surfaces)
      if ( vi0 != vi1 )
      {
        if ( text_log )
        {
          text_log->Print("brep.m_T[%d] trim is not valid.\n",trim_index);
          text_log->PushIndent();
          text_log->Print("trim.m_vi[] = [%d,%d] but brep.m_C2[trim.m_c2i=%d]->IsClosed()=true\n",
                          vi0, vi1, trim.m_c2i );
          text_log->PopIndent();
        }
        return ON_BrepIsNotValid();
      }
    }
    else if ( vi0 == vi1 )
    {
      // TODO: check that trim start/end is a closed surface seam point.
    }
    else
    {
      // vi0 != vi1
      // TODO: check that trim start/end is not a closed surface seam point.
    }
    int i;
    for ( i = 0; i < edge.m_ti.Count(); i++ ) 
    {
      if ( edge.m_ti[i] == trim_index )
      {
        trim_eti = i;
        break;
      }
    }

    if ( trim_eti < 0 )
    {
      if ( text_log )
      {
        text_log->Print("brep.m_T[%d] trim is not valid.\n",trim_index);
        text_log->PushIndent();
        text_log->Print("trim index %d is not in brep.m_E[trim.m_ei=%d].m_ti[]\n",
                        trim_index, trim.m_ei );
        text_log->PopIndent();
      }
      return ON_BrepIsNotValid();
    }

    if ( edge.m_ti.Count() == 2 )
    {
      int other_ti = edge.m_ti[ (edge.m_ti[0]==trim_index)?1:0 ];
      if ( other_ti >= 0 && other_ti < m_T.Count() && other_ti != trim_index )
      {
        const ON_BrepTrim& other_trim = m_T[other_ti];
        if ( other_trim.m_li == trim.m_li )
        {
          if ( trim.m_type != ON_BrepTrim::seam )
          {
            if ( text_log )
            {
              text_log->Print("brep.m_T[%d] trim is not valid.\n",trim_index);
              text_log->PushIndent();
              text_log->Print("trim.m_type!=seam but brep.m_E[trim.m_ei=%d] references two trims in loop trim.m_li=%d.\n",
                              trim.m_ei,trim.m_li);
              text_log->PopIndent();
            }
            return ON_BrepIsNotValid();
          }
        }
      }
    }
  }
  if ( trim.m_li < 0 || trim.m_li >= m_L.Count() )
  {
    if ( text_log )
    {
      text_log->Print("brep.m_T[%d] trim is not valid.\n",trim_index);
      text_log->PushIndent();
      text_log->Print("trim.m_li = %d (should be >= 0 and <brep.m_L.Count()=%d\n", trim.m_li,m_L.Count() );
      text_log->PopIndent();
    }
    return ON_BrepIsNotValid();
  }

  if ( trim.m_ei >= 0 && trim_eti < 0 )
  {
    if ( text_log )
    {
      text_log->Print("brep.m_T[%d] trim is not valid.\n",trim_index);
      text_log->PushIndent();
      text_log->Print("brep.m_E[trim.m_ei=%d].m_ti[] does not reference the trim.\n",trim.m_ei);
      text_log->PopIndent();
    }
    return ON_BrepIsNotValid();
  }


  switch ( trim.m_type )
  {
  case ON_BrepTrim::unknown:
    {
      if ( text_log )
      {
        text_log->Print("brep.m_T[%d] trim is not valid.\n",trim_index);
        text_log->PushIndent();
        text_log->Print("trim.m_type = unknown (should be set to the correct ON_BrepTrim::TYPE value)\n");
        text_log->PopIndent();
      }
      return ON_BrepIsNotValid();
    }
    break;
  case ON_BrepTrim::boundary:
    {
      const ON_BrepLoop& loop = m_L[trim.m_li];
      const ON_BrepEdge& edge = m_E[trim.m_ei];
      if ( edge.m_ti.Count() > 1 )
      {
        if ( text_log )
        {
          text_log->Print("brep.m_T[%d] trim is not valid.\n",trim_index);
          text_log->PushIndent();
          text_log->Print("trim.m_type = boundary but brep.m_E[trim.m_ei=%d] has 2 or more trims.\n",trim.m_ei);
          text_log->PopIndent();
        }
        return ON_BrepIsNotValid();
      }
      if ( loop.m_type != ON_BrepLoop::outer && loop.m_type != ON_BrepLoop::inner )
      {
        if ( text_log )
        {
          text_log->Print("brep.m_T[%d] trim is not valid.\n",trim_index);
          text_log->PushIndent();
          text_log->Print("trim.m_type = boundary but brep.m_L[trim.m_li=%d].m_type is not inner or outer.\n",trim.m_li);
          text_log->PopIndent();
        }
        return ON_BrepIsNotValid();
      }
    }
    break;
  case ON_BrepTrim::mated:
    {
      const ON_BrepLoop& loop = m_L[trim.m_li];
      const ON_BrepEdge& edge = m_E[trim.m_ei];
      if ( edge.m_ti.Count() < 2 )
      {
        if ( text_log )
        {
          text_log->Print("brep.m_T[%d] trim is not valid.\n",trim_index);
          text_log->PushIndent();
          text_log->Print("trim.m_type = mated but brep.m_E[trim.m_ei=%d] only references this trim.\n",trim.m_ei);
          text_log->PopIndent();
        }
        return ON_BrepIsNotValid();
      }
      if ( loop.m_type != ON_BrepLoop::outer && loop.m_type != ON_BrepLoop::inner )
      {
        if ( text_log )
        {
          text_log->Print("brep.m_T[%d] trim is not valid.\n",trim_index);
          text_log->PushIndent();
          text_log->Print("trim.m_type = mated but brep.m_L[trim.m_li=%d].m_type is not inner or outer.\n",trim.m_li);
          text_log->PopIndent();
        }
        return ON_BrepIsNotValid();
      }
    }
    break;
  case ON_BrepTrim::seam:
    {
      const ON_BrepLoop& loop = m_L[trim.m_li];
      const ON_BrepEdge& edge = m_E[trim.m_ei];
      if ( edge.m_ti.Count() < 2 )
      {
        if ( text_log )
        {
          text_log->Print("brep.m_T[%d] trim is not valid.\n",trim_index);
          text_log->PushIndent();
          text_log->Print("trim.m_type = seam but brep.m_E[trim.m_ei=%d] < 2.\n",trim.m_ei);
          text_log->PopIndent();
        }
        return ON_BrepIsNotValid();
      }
      int other_ti = -1;
      for ( int eti = 0; eti < edge.m_ti.Count(); eti++ ) 
      {
        if ( trim_eti == eti )
          continue;
        int i = edge.m_ti[eti];
        if ( i == trim_index )
        {
          if ( text_log )
          {
            text_log->Print("brep.m_E[%d] trim is not valid.\n",trim.m_ei);
            text_log->PushIndent();
            text_log->Print("edge.m_ti[%d] = m_ti[%d] = %d.\n",trim_eti,eti,trim_index);
            text_log->PopIndent();
          }
          return ON_BrepIsNotValid();
        }

        if ( i < 0 || i >= m_T.Count() )
        {
          if ( text_log )
          {
            text_log->Print("brep.m_E[%d] trim is not valid.\n",trim.m_ei);
            text_log->PushIndent();
            text_log->Print("edge.m_ti[%d]=%d is not a valid m_T[] index.\n",eti,i);
            text_log->PopIndent();
          }
          return ON_BrepIsNotValid();
        }

        const ON_BrepTrim& other_trim = m_T[i];
        if ( other_trim.m_type == ON_BrepTrim::seam && other_trim.m_li == trim.m_li )
        {
          if ( other_ti < 0 )
            other_ti = i;
          else
          {
            if ( text_log )
            {
              text_log->Print("brep.m_T[%d,%d, or %d] trim is not valid.\n",trim_index,other_ti,i);
              text_log->PushIndent();
              text_log->Print("All three trims have m_type = seam m_ei=%d and m_li = %d.\n",trim.m_ei,trim.m_li);
              text_log->PopIndent();
            }
            return ON_BrepIsNotValid();
          }
        }
      }

      if ( other_ti < 0 )
      {
        if ( text_log )
        {
          text_log->Print("brep.m_T[%d] trim is not valid.\n",trim_index);
          text_log->PushIndent();
          text_log->Print("trim.m_type = seam but its other trim is not in the loop.\n");
          text_log->PopIndent();
        }
        return ON_BrepIsNotValid();
      }

      if ( loop.m_type != ON_BrepLoop::outer && edge.m_ti.Count() <= 2 )
      {
        if ( text_log )
        {
          text_log->Print("brep.m_T[%d] trim is not valid.\n",trim_index);
          text_log->PushIndent();
          text_log->Print("trim.m_type = seam, the edge is manifold, but brep.m_L[trim.m_li=%d].m_type is not outer.\n",trim.m_li);
          text_log->PopIndent();
        }
        return ON_BrepIsNotValid();
      }
      // 31 Jan 2002 - The definition of a seam trim is a trim that is connected to
      //               an edge, is part of loop, and exactly one other trim in the
      //               same loop is connected to the same edge.  This can happen
      //               on the interior of a surface (like an annulus in a plane)
      //               and on non-manifold edges.
      //if ( trim.m_iso != ON_Surface::W_iso && trim.m_iso != ON_Surface::N_iso &&
      //     trim.m_iso != ON_Surface::E_iso && trim.m_iso != ON_Surface::S_iso )
      //{
      //  if ( text_log )
      //  {
      //    text_log->Print("brep.m_T[%d] trim is not valid.\n",trim_index);
      //    text_log->PushIndent();
      //    text_log->Print("trim.m_type = seam but trim.m_iso != N/S/E/W_iso\n");
      //    text_log->PopIndent();
      //  }
      //  return ON_BrepIsNotValid();
      //}
    }
    break;
  case ON_BrepTrim::singular:
    // most requirements are checked above
    if ( trim.m_iso != ON_Surface::W_iso && trim.m_iso != ON_Surface::N_iso &&
         trim.m_iso != ON_Surface::E_iso && trim.m_iso != ON_Surface::S_iso )
    {
      if ( text_log )
      {
        text_log->Print("brep.m_T[%d] trim is not valid.\n",trim_index);
        text_log->PushIndent();
        text_log->Print("trim.m_type = singular but trim.m_iso != N/S/E/W_iso\n");
        text_log->PopIndent();
      }
      return ON_BrepIsNotValid();
    }
    break;
  case ON_BrepTrim::crvonsrf:
    {
      const ON_BrepLoop& loop = m_L[trim.m_li];
      if ( loop.m_type != ON_BrepLoop::crvonsrf )
      {
        return ON_BrepIsNotValid();
      }
      if ( trim.m_c2i < 0 || trim.m_c2i >= m_C2.Count() )
      {
        return ON_BrepIsNotValid();
      }
      if ( trim.m_ei < 0 || trim.m_ei >= m_E.Count() )
      {
        return ON_BrepIsNotValid();
      }
    }
    break;
  case ON_BrepTrim::ptonsrf:
    {
      const ON_BrepLoop& loop = m_L[trim.m_li];
      if ( loop.m_type != ON_BrepLoop::ptonsrf )
      {
        return ON_BrepIsNotValid();
      }
      if ( trim.m_ei != -1 )
      {
        return ON_BrepIsNotValid();
      }
      if ( trim.m_c2i != -1 )
      {
        return ON_BrepIsNotValid();
      }
      if ( trim.m_pbox.m_min.x != trim.m_pbox.m_max.x || trim.m_pbox.m_min.y != trim.m_pbox.m_max.y || trim.m_pbox.m_min.z != trim.m_pbox.m_max.z ) 
      {
        // m_pbox must be a single point that defines surface parameters of the point.
        return ON_BrepIsNotValid();
      }
      if ( trim.m_pbox.m_min.x == ON_UNSET_VALUE || trim.m_pbox.m_min.y == ON_UNSET_VALUE || trim.m_pbox.m_min.z != 0.0 ) 
      {
        // m_pbox must be a single point that defines surface parameters of the point.
        return ON_BrepIsNotValid();
      }
    }
    break;

  case ON_BrepTrim::slit:
    {
      if ( text_log )
      {
        text_log->Print("brep.m_T[%d] trim is not valid.\n",trim_index);
        text_log->PushIndent();
        text_log->Print("trim.m_type = ON_BrepTrim::slit (should be set to the correct ON_BrepTrim::TYPE value)\n");
        text_log->PopIndent();
      }
      return ON_BrepIsNotValid();
    }
    break;

  case ON_BrepTrim::trim_type_count:
    {
      if ( text_log )
      {
        text_log->Print("brep.m_T[%d] trim is not valid.\n",trim_index);
        text_log->PushIndent();
        text_log->Print("trim.m_type = type_count (should be set to the correct ON_BrepTrim::TYPE value)\n");
        text_log->PopIndent();
      }
      return ON_BrepIsNotValid();
    }
    break;

  default:
    {
      if ( text_log )
      {
        text_log->Print("brep.m_T[%d] trim is not valid.\n",trim_index);
        text_log->PushIndent();
        text_log->Print("trim.m_type = garbage (should be set to the correct ON_BrepTrim::TYPE value)\n");
        text_log->PopIndent();
      }
      return ON_BrepIsNotValid();
    }
    break;
  }

  if ( trim.m_tolerance[0] < 0.0 )
  {
    if ( text_log )
    {
      text_log->Print("brep.m_T[%d] trim is not valid.\n",trim_index);
      text_log->PushIndent();
      text_log->Print("trim.m_tolerance[0] = %g (should be >= 0.0)\n",trim.m_tolerance[0]);
      text_log->PopIndent();
    }
    return ON_BrepIsNotValid();
  }
  if ( trim.m_tolerance[1] < 0.0 )
  {
    if ( text_log )
    {
      text_log->Print("brep.m_T[%d] trim is not valid.\n",trim_index);
      text_log->PushIndent();
      text_log->Print("trim.m_tolerance[1] = %g (should be >= 0.0)\n",trim.m_tolerance[1]);
      text_log->PopIndent();
    }
    return ON_BrepIsNotValid();
  }

  if ( !trim.m_pbox.IsValid() )
  {
    if ( text_log )
    {
      text_log->Print("brep.m_T[%d] trim is not valid.\n",trim_index);
      text_log->PushIndent();
      text_log->Print("trim.m_pbox is not valid.\n");
      text_log->PopIndent();
    }
    return ON_BrepIsNotValid();
  }

  if ( trim.m_brep != this )
  {
    if ( text_log )
    {
      text_log->Print("brep.m_T[%d] trim is not valid.\n",trim_index);
      text_log->PushIndent();
      text_log->Print("trim.m_brep does not point to parent brep.\n");
      text_log->PopIndent();
    }
    return ON_BrepIsNotValid();
  }

  return true;
}